

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall Blip_Impulse_::treble_eq(Blip_Impulse_ *this,blip_eq_t *new_eq)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  imp_t *piVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int w;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float buf [352];
  float afStack_5b8 [354];
  
  if ((((this->generate != false) || (new_eq->treble != (this->eq).treble)) ||
      (NAN(new_eq->treble) || NAN((this->eq).treble))) ||
     ((new_eq->cutoff != (this->eq).cutoff || (new_eq->sample_rate != (this->eq).sample_rate)))) {
    this->generate = false;
    lVar19 = new_eq->cutoff;
    (this->eq).treble = new_eq->treble;
    (this->eq).cutoff = lVar19;
    (this->eq).sample_rate = new_eq->sample_rate;
    dVar2 = pow(10.0,(this->eq).treble * 0.05);
    auVar29._0_8_ = (double)(this->eq).sample_rate;
    auVar28._0_8_ = (double)((this->eq).cutoff * 2);
    auVar28._8_8_ = 0x40e5888000000000;
    auVar29._8_8_ = auVar29._0_8_;
    auVar29 = divpd(auVar28,auVar29);
    dVar27 = auVar29._0_8_;
    bVar20 = dVar27 < auVar29._8_8_ * 0.95;
    bVar1 = dVar27 < 0.95;
    if (!bVar1 || !bVar20) {
      dVar27 = 0.5;
    }
    dVar21 = 1.0;
    if ((bVar1 && bVar20) && (dVar21 = 5e-06, 5e-06 <= dVar2)) {
      dVar21 = dVar2;
    }
    dVar2 = dVar27 * 4096.0;
    dVar21 = pow(dVar21,1.0 / (auVar29._8_8_ * 4096.0 - dVar2));
    dVar24 = pow(dVar21,dVar2);
    dVar22 = pow(dVar21,4096.0);
    dVar3 = pow(dVar21,dVar2);
    iVar16 = this->width * 0x20 + -0x40;
    if (iVar16 == 0) {
      dVar24 = 0.0;
    }
    else {
      dVar3 = dVar3 * (1.0 / dVar24);
      dVar22 = (1.0 / dVar24) * dVar22;
      uVar17 = this->width * 0x10 + 0x7fffffe0;
      iVar13 = uVar17 * 2 + -1;
      lVar19 = (long)((ulong)uVar17 << 0x21) >> 0x21;
      dVar24 = 0.0;
      do {
        dVar4 = (double)iVar13 * 1.1984224905356572e-05;
        dVar23 = cos(dVar4);
        dVar5 = cos(dVar2 * dVar4);
        dVar6 = cos((dVar27 * 4096.0 + -1.0) * dVar4);
        dVar25 = dVar23 * -2.0 + 2.0;
        dVar26 = dVar21 * (dVar21 - (dVar23 + dVar23)) + 1.0;
        dVar7 = cos(dVar4 * 4095.0);
        dVar8 = cos(dVar4 * 4096.0);
        dVar23 = ((((1.0 - dVar23) - dVar5) + dVar6) * dVar26 +
                 (dVar5 * dVar3 +
                 dVar6 * -dVar3 * dVar21 + dVar7 * dVar21 * dVar22 + dVar8 * -dVar22) * dVar25) /
                 (dVar26 * dVar25);
        if (0xc < this->width) {
          dVar4 = cos(dVar4 * 136.53333333333333);
          dVar23 = dVar23 * dVar4 * dVar4;
        }
        dVar24 = dVar24 + (double)(float)dVar23;
        afStack_5b8[lVar19 + -1] = (float)dVar23;
        lVar19 = lVar19 + -1;
        iVar13 = iVar13 + -2;
      } while (lVar19 != 0);
    }
    iVar13 = this->res;
    if (1 < iVar13 + 3U) {
      iVar11 = iVar13 / 2;
      iVar15 = this->width / 2;
      piVar12 = this->impulse;
      iVar14 = (uint)(1 < iVar13) * 0x10 + iVar15 * -0x20 + 0x10;
      do {
        iVar18 = -iVar15;
        iVar9 = iVar14;
        if (-iVar15 < iVar15) {
          do {
            dVar2 = 0.0;
            iVar10 = 0x1f;
            do {
              uVar17 = iVar10 + iVar9 >> 0x1f ^ iVar10 + iVar9;
              if ((int)uVar17 < iVar16 >> 1) {
                dVar2 = dVar2 + (double)afStack_5b8[uVar17];
              }
              bVar20 = iVar10 != 0;
              iVar10 = iVar10 + -1;
            } while (bVar20);
            dVar2 = floor(dVar2 * (16384.0 / dVar24) + 16384.5);
            *piVar12 = (imp_t)(int)dVar2;
            piVar12 = piVar12 + 1;
            iVar18 = iVar18 + 1;
            iVar9 = iVar9 + 0x20;
          } while (iVar18 != iVar15);
        }
        iVar14 = iVar14 - (int)(0x20 / (long)iVar13);
        bVar20 = iVar11 != 0;
        iVar11 = iVar11 + -1;
      } while (bVar20);
    }
    dVar2 = this->volume_unit_;
    if (0.0 <= dVar2) {
      this->volume_unit_ = -1.0;
      volume_unit(this,dVar2);
    }
  }
  return;
}

Assistant:

void Blip_Impulse_::treble_eq( const blip_eq_t& new_eq )
{
	if ( !generate && new_eq.treble == eq.treble && new_eq.cutoff == eq.cutoff &&
			new_eq.sample_rate == eq.sample_rate )
		return; // already calculated with same parameters
	
	generate = false;
	eq = new_eq;
	
	double treble = pow( 10.0, 1.0 / 20 * eq.treble ); // dB (-6dB = 0.50)
	if ( treble < 0.000005 )
		treble = 0.000005;
	
	const double treble_freq = 22050.0; // treble level at 22 kHz harmonic
	const double sample_rate = eq.sample_rate;
	const double pt = treble_freq * 2 / sample_rate;
	double cutoff = eq.cutoff * 2 / sample_rate;
	if ( cutoff >= pt * 0.95 || cutoff >= 0.95 ) {
		cutoff = 0.5;
		treble = 1.0;
	}
	
	// DSF Synthesis (See T. Stilson & J. Smith (1996),
	// Alias-free digital synthesis of classic analog waveforms)
	
	// reduce adjacent impulse interference by using small part of wide impulse
	const double n_harm = 4096;
	const double rolloff = pow( treble, 1.0 / (n_harm * pt - n_harm * cutoff) );
	const double rescale = 1.0 / pow( rolloff, n_harm * cutoff );
	
	const double pow_a_n = rescale * pow( rolloff, n_harm );
	const double pow_a_nc = rescale * pow( rolloff, n_harm * cutoff );
	
	double total = 0.0;
	const double to_angle = pi / 2 / n_harm / max_res;
	
	float buf [max_res * (Blip_Buffer::widest_impulse_ - 2) / 2];
	const int size = max_res * (width - 2) / 2;
	for ( int i = size; i--; )
	{
		double angle = (i * 2 + 1) * to_angle;
		
		// equivalent
		//double y =     dsf( angle, n_harm * cutoff, 1.0 );
		//y -= rescale * dsf( angle, n_harm * cutoff, rolloff );
		//y += rescale * dsf( angle, n_harm,          rolloff );
		
		const double cos_angle = cos( angle );
		const double cos_nc_angle = cos( n_harm * cutoff * angle );
		const double cos_nc1_angle = cos( (n_harm * cutoff - 1.0) * angle );
		
		double b = 2.0 - 2.0 * cos_angle;
		double a = 1.0 - cos_angle - cos_nc_angle + cos_nc1_angle;
		
		double d = 1.0 + rolloff * (rolloff - 2.0 * cos_angle);
		double c = pow_a_n * rolloff * cos( (n_harm - 1.0) * angle ) -
				pow_a_n * cos( n_harm * angle ) -
				pow_a_nc * rolloff * cos_nc1_angle +
				pow_a_nc * cos_nc_angle;
		
		// optimization of a / b + c / d
		double y = (a * d + c * b) / (b * d);
		
		// fixed window which affects wider impulses more
		if ( width > 12 ) {
			double window = cos( n_harm / 1.25 / Blip_Buffer::widest_impulse_ * angle );
			y *= window * window;
		}
		
		total += (float) y;
		buf [i] = (float) y;
	}
	
	// integrate runs of length 'max_res'
	double factor = impulse_amp * 0.5 / total; // 0.5 accounts for other mirrored half
	imp_t* imp = impulse;
	const int step = max_res / res;
	int offset = res > 1 ? max_res : max_res / 2;
	for ( int n = res / 2 + 1; n--; offset -= step )
	{
		for ( int w = -width / 2; w < width / 2; w++ )
		{
			double sum = 0;
			for ( int i = max_res; i--; )
			{
				int index = w * max_res + offset + i;
				if ( index < 0 )
					index = -index - 1;
				if ( index < size )
					sum += buf [index];
			}
			*imp++ = (imp_t) floor( sum * factor + (impulse_offset + 0.5) );
		}
	}
	
	// rescale
	double unit = volume_unit_;
	if ( unit >= 0 ) {
		volume_unit_ = -1;
		volume_unit( unit );
	}
}